

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::LayerParameter::SharedDtor(LayerParameter *this)

{
  string *psVar1;
  pointer pcVar2;
  
  psVar1 = (this->name_).ptr_;
  if (psVar1 != (string *)0x0 &&
      psVar1 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &psVar1->field_2) {
      operator_delete(pcVar2,(psVar1->field_2)._M_allocated_capacity + 1);
    }
    operator_delete(psVar1,0x20);
  }
  psVar1 = (this->type_).ptr_;
  if (psVar1 != (string *)0x0 &&
      psVar1 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &psVar1->field_2) {
      operator_delete(pcVar2,(psVar1->field_2)._M_allocated_capacity + 1);
    }
    operator_delete(psVar1,0x20);
  }
  if (this != (LayerParameter *)&_LayerParameter_default_instance_) {
    if (this->transform_param_ != (TransformationParameter *)0x0) {
      (*(this->transform_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
    }
    if (this != (LayerParameter *)&_LayerParameter_default_instance_) {
      if (this->loss_param_ != (LossParameter *)0x0) {
        (*(this->loss_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
      }
      if (this != (LayerParameter *)&_LayerParameter_default_instance_) {
        if (this->accuracy_param_ != (AccuracyParameter *)0x0) {
          (*(this->accuracy_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
        }
        if (this != (LayerParameter *)&_LayerParameter_default_instance_) {
          if (this->argmax_param_ != (ArgMaxParameter *)0x0) {
            (*(this->argmax_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
          }
          if (this != (LayerParameter *)&_LayerParameter_default_instance_) {
            if (this->concat_param_ != (ConcatParameter *)0x0) {
              (*(this->concat_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
            }
            if (this != (LayerParameter *)&_LayerParameter_default_instance_) {
              if (this->contrastive_loss_param_ != (ContrastiveLossParameter *)0x0) {
                (*(this->contrastive_loss_param_->super_Message).super_MessageLite._vptr_MessageLite
                  [1])();
              }
              if (this != (LayerParameter *)&_LayerParameter_default_instance_) {
                if (this->convolution_param_ != (ConvolutionParameter *)0x0) {
                  (*(this->convolution_param_->super_Message).super_MessageLite._vptr_MessageLite[1]
                  )();
                }
                if (this != (LayerParameter *)&_LayerParameter_default_instance_) {
                  if (this->data_param_ != (DataParameter *)0x0) {
                    (*(this->data_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
                  }
                  if (this != (LayerParameter *)&_LayerParameter_default_instance_) {
                    if (this->dropout_param_ != (DropoutParameter *)0x0) {
                      (*(this->dropout_param_->super_Message).super_MessageLite._vptr_MessageLite[1]
                      )();
                    }
                    if (this != (LayerParameter *)&_LayerParameter_default_instance_) {
                      if (this->dummy_data_param_ != (DummyDataParameter *)0x0) {
                        (*(this->dummy_data_param_->super_Message).super_MessageLite.
                          _vptr_MessageLite[1])();
                      }
                      if (this != (LayerParameter *)&_LayerParameter_default_instance_) {
                        if (this->eltwise_param_ != (EltwiseParameter *)0x0) {
                          (*(this->eltwise_param_->super_Message).super_MessageLite.
                            _vptr_MessageLite[1])();
                        }
                        if (this != (LayerParameter *)&_LayerParameter_default_instance_) {
                          if (this->exp_param_ != (ExpParameter *)0x0) {
                            (*(this->exp_param_->super_Message).super_MessageLite._vptr_MessageLite
                              [1])();
                          }
                          if (this != (LayerParameter *)&_LayerParameter_default_instance_) {
                            if (this->hdf5_data_param_ != (HDF5DataParameter *)0x0) {
                              (*(this->hdf5_data_param_->super_Message).super_MessageLite.
                                _vptr_MessageLite[1])();
                            }
                            if (this != (LayerParameter *)&_LayerParameter_default_instance_) {
                              if (this->hdf5_output_param_ != (HDF5OutputParameter *)0x0) {
                                (*(this->hdf5_output_param_->super_Message).super_MessageLite.
                                  _vptr_MessageLite[1])();
                              }
                              if (this != (LayerParameter *)&_LayerParameter_default_instance_) {
                                if (this->hinge_loss_param_ != (HingeLossParameter *)0x0) {
                                  (*(this->hinge_loss_param_->super_Message).super_MessageLite.
                                    _vptr_MessageLite[1])();
                                }
                                if (this != (LayerParameter *)&_LayerParameter_default_instance_) {
                                  if (this->image_data_param_ != (ImageDataParameter *)0x0) {
                                    (*(this->image_data_param_->super_Message).super_MessageLite.
                                      _vptr_MessageLite[1])();
                                  }
                                  if (this != (LayerParameter *)&_LayerParameter_default_instance_)
                                  {
                                    if (this->infogain_loss_param_ != (InfogainLossParameter *)0x0)
                                    {
                                      (*(this->infogain_loss_param_->super_Message).
                                        super_MessageLite._vptr_MessageLite[1])();
                                    }
                                    if (this != (LayerParameter *)&_LayerParameter_default_instance_
                                       ) {
                                      if (this->inner_product_param_ != (InnerProductParameter *)0x0
                                         ) {
                                        (*(this->inner_product_param_->super_Message).
                                          super_MessageLite._vptr_MessageLite[1])();
                                      }
                                      if (this != (LayerParameter *)
                                                  &_LayerParameter_default_instance_) {
                                        if (this->lrn_param_ != (LRNParameter *)0x0) {
                                          (*(this->lrn_param_->super_Message).super_MessageLite.
                                            _vptr_MessageLite[1])();
                                        }
                                        if (this != (LayerParameter *)
                                                    &_LayerParameter_default_instance_) {
                                          if (this->memory_data_param_ != (MemoryDataParameter *)0x0
                                             ) {
                                            (*(this->memory_data_param_->super_Message).
                                              super_MessageLite._vptr_MessageLite[1])();
                                          }
                                          if (this != (LayerParameter *)
                                                      &_LayerParameter_default_instance_) {
                                            if (this->mvn_param_ != (MVNParameter *)0x0) {
                                              (*(this->mvn_param_->super_Message).super_MessageLite.
                                                _vptr_MessageLite[1])();
                                            }
                                            if (this != (LayerParameter *)
                                                        &_LayerParameter_default_instance_) {
                                              if (this->pooling_param_ != (PoolingParameter *)0x0) {
                                                (*(this->pooling_param_->super_Message).
                                                  super_MessageLite._vptr_MessageLite[1])();
                                              }
                                              if (this != (LayerParameter *)
                                                          &_LayerParameter_default_instance_) {
                                                if (this->power_param_ != (PowerParameter *)0x0) {
                                                  (*(this->power_param_->super_Message).
                                                    super_MessageLite._vptr_MessageLite[1])();
                                                }
                                                if (this != (LayerParameter *)
                                                            &_LayerParameter_default_instance_) {
                                                  if (this->relu_param_ != (ReLUParameter *)0x0) {
                                                    (*(this->relu_param_->super_Message).
                                                      super_MessageLite._vptr_MessageLite[1])();
                                                  }
                                                  if (this != (LayerParameter *)
                                                              &_LayerParameter_default_instance_) {
                                                    if (this->sigmoid_param_ !=
                                                        (SigmoidParameter *)0x0) {
                                                      (*(this->sigmoid_param_->super_Message).
                                                        super_MessageLite._vptr_MessageLite[1])();
                                                    }
                                                    if (this != (LayerParameter *)
                                                                &_LayerParameter_default_instance_)
                                                    {
                                                      if (this->softmax_param_ !=
                                                          (SoftmaxParameter *)0x0) {
                                                        (*(this->softmax_param_->super_Message).
                                                          super_MessageLite._vptr_MessageLite[1])();
                                                      }
                                                      if (this != (LayerParameter *)
                                                                  &_LayerParameter_default_instance_
                                                         ) {
                                                        if (this->slice_param_ !=
                                                            (SliceParameter *)0x0) {
                                                          (*(this->slice_param_->super_Message).
                                                            super_MessageLite._vptr_MessageLite[1])
                                                                    ();
                                                        }
                                                        if (this != (LayerParameter *)
                                                                    &
                                                  _LayerParameter_default_instance_) {
                                                    if (this->tanh_param_ != (TanHParameter *)0x0) {
                                                      (*(this->tanh_param_->super_Message).
                                                        super_MessageLite._vptr_MessageLite[1])();
                                                    }
                                                    if (this != (LayerParameter *)
                                                                &_LayerParameter_default_instance_)
                                                    {
                                                      if (this->threshold_param_ !=
                                                          (ThresholdParameter *)0x0) {
                                                        (*(this->threshold_param_->super_Message).
                                                          super_MessageLite._vptr_MessageLite[1])();
                                                      }
                                                      if (this != (LayerParameter *)
                                                                  &_LayerParameter_default_instance_
                                                         ) {
                                                        if (this->window_data_param_ !=
                                                            (WindowDataParameter *)0x0) {
                                                          (*(this->window_data_param_->super_Message
                                                            ).super_MessageLite._vptr_MessageLite[1]
                                                          )();
                                                        }
                                                        if (this != (LayerParameter *)
                                                                    &
                                                  _LayerParameter_default_instance_) {
                                                    if (this->python_param_ !=
                                                        (PythonParameter *)0x0) {
                                                      (*(this->python_param_->super_Message).
                                                        super_MessageLite._vptr_MessageLite[1])();
                                                    }
                                                    if (this != (LayerParameter *)
                                                                &_LayerParameter_default_instance_)
                                                    {
                                                      if (this->prelu_param_ !=
                                                          (PReLUParameter *)0x0) {
                                                        (*(this->prelu_param_->super_Message).
                                                          super_MessageLite._vptr_MessageLite[1])();
                                                      }
                                                      if (this != (LayerParameter *)
                                                                  &_LayerParameter_default_instance_
                                                         ) {
                                                        if (this->spp_param_ != (SPPParameter *)0x0)
                                                        {
                                                          (*(this->spp_param_->super_Message).
                                                            super_MessageLite._vptr_MessageLite[1])
                                                                    ();
                                                        }
                                                        if (this != (LayerParameter *)
                                                                    &
                                                  _LayerParameter_default_instance_) {
                                                    if (this->reshape_param_ !=
                                                        (ReshapeParameter *)0x0) {
                                                      (*(this->reshape_param_->super_Message).
                                                        super_MessageLite._vptr_MessageLite[1])();
                                                    }
                                                    if (this != (LayerParameter *)
                                                                &_LayerParameter_default_instance_)
                                                    {
                                                      if (this->log_param_ != (LogParameter *)0x0) {
                                                        (*(this->log_param_->super_Message).
                                                          super_MessageLite._vptr_MessageLite[1])();
                                                      }
                                                      if (this != (LayerParameter *)
                                                                  &_LayerParameter_default_instance_
                                                         ) {
                                                        if (this->flatten_param_ !=
                                                            (FlattenParameter *)0x0) {
                                                          (*(this->flatten_param_->super_Message).
                                                            super_MessageLite._vptr_MessageLite[1])
                                                                    ();
                                                        }
                                                        if (this != (LayerParameter *)
                                                                    &
                                                  _LayerParameter_default_instance_) {
                                                    if (this->reduction_param_ !=
                                                        (ReductionParameter *)0x0) {
                                                      (*(this->reduction_param_->super_Message).
                                                        super_MessageLite._vptr_MessageLite[1])();
                                                    }
                                                    if (this != (LayerParameter *)
                                                                &_LayerParameter_default_instance_)
                                                    {
                                                      if (this->embed_param_ !=
                                                          (EmbedParameter *)0x0) {
                                                        (*(this->embed_param_->super_Message).
                                                          super_MessageLite._vptr_MessageLite[1])();
                                                      }
                                                      if (this != (LayerParameter *)
                                                                  &_LayerParameter_default_instance_
                                                         ) {
                                                        if (this->tile_param_ !=
                                                            (TileParameter *)0x0) {
                                                          (*(this->tile_param_->super_Message).
                                                            super_MessageLite._vptr_MessageLite[1])
                                                                    ();
                                                        }
                                                        if (this != (LayerParameter *)
                                                                    &
                                                  _LayerParameter_default_instance_) {
                                                    if (this->batch_norm_param_ !=
                                                        (BatchNormParameter *)0x0) {
                                                      (*(this->batch_norm_param_->super_Message).
                                                        super_MessageLite._vptr_MessageLite[1])();
                                                    }
                                                    if (this != (LayerParameter *)
                                                                &_LayerParameter_default_instance_)
                                                    {
                                                      if (this->elu_param_ != (ELUParameter *)0x0) {
                                                        (*(this->elu_param_->super_Message).
                                                          super_MessageLite._vptr_MessageLite[1])();
                                                      }
                                                      if (this != (LayerParameter *)
                                                                  &_LayerParameter_default_instance_
                                                         ) {
                                                        if (this->bias_param_ !=
                                                            (BiasParameter *)0x0) {
                                                          (*(this->bias_param_->super_Message).
                                                            super_MessageLite._vptr_MessageLite[1])
                                                                    ();
                                                        }
                                                        if (this != (LayerParameter *)
                                                                    &
                                                  _LayerParameter_default_instance_) {
                                                    if (this->scale_param_ != (ScaleParameter *)0x0)
                                                    {
                                                      (*(this->scale_param_->super_Message).
                                                        super_MessageLite._vptr_MessageLite[1])();
                                                    }
                                                    if (this != (LayerParameter *)
                                                                &_LayerParameter_default_instance_)
                                                    {
                                                      if (this->input_param_ !=
                                                          (InputParameter *)0x0) {
                                                        (*(this->input_param_->super_Message).
                                                          super_MessageLite._vptr_MessageLite[1])();
                                                      }
                                                      if (this != (LayerParameter *)
                                                                  &_LayerParameter_default_instance_
                                                         ) {
                                                        if (this->crop_param_ !=
                                                            (CropParameter *)0x0) {
                                                          (*(this->crop_param_->super_Message).
                                                            super_MessageLite._vptr_MessageLite[1])
                                                                    ();
                                                        }
                                                        if (this != (LayerParameter *)
                                                                    &
                                                  _LayerParameter_default_instance_) {
                                                    if (this->parameter_param_ !=
                                                        (ParameterParameter *)0x0) {
                                                      (*(this->parameter_param_->super_Message).
                                                        super_MessageLite._vptr_MessageLite[1])();
                                                    }
                                                    if ((this != (LayerParameter *)
                                                                 &_LayerParameter_default_instance_)
                                                       && (this->recurrent_param_ !=
                                                           (RecurrentParameter *)0x0)) {
                                                      (*(this->recurrent_param_->super_Message).
                                                        super_MessageLite._vptr_MessageLite[1])();
                                                      return;
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void LayerParameter::SharedDtor() {
  name_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  type_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) {
    delete transform_param_;
  }
  if (this != internal_default_instance()) {
    delete loss_param_;
  }
  if (this != internal_default_instance()) {
    delete accuracy_param_;
  }
  if (this != internal_default_instance()) {
    delete argmax_param_;
  }
  if (this != internal_default_instance()) {
    delete concat_param_;
  }
  if (this != internal_default_instance()) {
    delete contrastive_loss_param_;
  }
  if (this != internal_default_instance()) {
    delete convolution_param_;
  }
  if (this != internal_default_instance()) {
    delete data_param_;
  }
  if (this != internal_default_instance()) {
    delete dropout_param_;
  }
  if (this != internal_default_instance()) {
    delete dummy_data_param_;
  }
  if (this != internal_default_instance()) {
    delete eltwise_param_;
  }
  if (this != internal_default_instance()) {
    delete exp_param_;
  }
  if (this != internal_default_instance()) {
    delete hdf5_data_param_;
  }
  if (this != internal_default_instance()) {
    delete hdf5_output_param_;
  }
  if (this != internal_default_instance()) {
    delete hinge_loss_param_;
  }
  if (this != internal_default_instance()) {
    delete image_data_param_;
  }
  if (this != internal_default_instance()) {
    delete infogain_loss_param_;
  }
  if (this != internal_default_instance()) {
    delete inner_product_param_;
  }
  if (this != internal_default_instance()) {
    delete lrn_param_;
  }
  if (this != internal_default_instance()) {
    delete memory_data_param_;
  }
  if (this != internal_default_instance()) {
    delete mvn_param_;
  }
  if (this != internal_default_instance()) {
    delete pooling_param_;
  }
  if (this != internal_default_instance()) {
    delete power_param_;
  }
  if (this != internal_default_instance()) {
    delete relu_param_;
  }
  if (this != internal_default_instance()) {
    delete sigmoid_param_;
  }
  if (this != internal_default_instance()) {
    delete softmax_param_;
  }
  if (this != internal_default_instance()) {
    delete slice_param_;
  }
  if (this != internal_default_instance()) {
    delete tanh_param_;
  }
  if (this != internal_default_instance()) {
    delete threshold_param_;
  }
  if (this != internal_default_instance()) {
    delete window_data_param_;
  }
  if (this != internal_default_instance()) {
    delete python_param_;
  }
  if (this != internal_default_instance()) {
    delete prelu_param_;
  }
  if (this != internal_default_instance()) {
    delete spp_param_;
  }
  if (this != internal_default_instance()) {
    delete reshape_param_;
  }
  if (this != internal_default_instance()) {
    delete log_param_;
  }
  if (this != internal_default_instance()) {
    delete flatten_param_;
  }
  if (this != internal_default_instance()) {
    delete reduction_param_;
  }
  if (this != internal_default_instance()) {
    delete embed_param_;
  }
  if (this != internal_default_instance()) {
    delete tile_param_;
  }
  if (this != internal_default_instance()) {
    delete batch_norm_param_;
  }
  if (this != internal_default_instance()) {
    delete elu_param_;
  }
  if (this != internal_default_instance()) {
    delete bias_param_;
  }
  if (this != internal_default_instance()) {
    delete scale_param_;
  }
  if (this != internal_default_instance()) {
    delete input_param_;
  }
  if (this != internal_default_instance()) {
    delete crop_param_;
  }
  if (this != internal_default_instance()) {
    delete parameter_param_;
  }
  if (this != internal_default_instance()) {
    delete recurrent_param_;
  }
}